

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecMult.c
# Opt level: O1

void Acec_MultFindPPs_rec(Gia_Man_t *p,int iObj,Vec_Int_t *vBold)

{
  Gia_Obj_t *pGVar1;
  ulong uVar2;
  uint uVar3;
  
  if ((-1 < iObj) && (iObj < p->nObjs)) {
    uVar2 = *(ulong *)(p->pObjs + (uint)iObj);
    uVar3 = (uint)uVar2;
    if ((uVar3 >> 0x1e & 1) == 0) {
      pGVar1 = p->pObjs + (uint)iObj;
      *(ulong *)pGVar1 = uVar2 | 0x40000000;
      if (-1 < (int)uVar3 && (~uVar3 & 0x1fffffff) != 0) {
        Acec_MultFindPPs_rec(p,iObj - (uVar3 & 0x1fffffff),vBold);
        Acec_MultFindPPs_rec(p,iObj - (*(uint *)&pGVar1->field_0x4 & 0x1fffffff),vBold);
        Vec_IntPush(vBold,iObj);
        return;
      }
    }
    return;
  }
  __assert_fail("v >= 0 && v < p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
}

Assistant:

void Acec_MultFindPPs_rec( Gia_Man_t * p, int iObj, Vec_Int_t * vBold )
{
    Gia_Obj_t * pObj;
    pObj = Gia_ManObj( p, iObj );
    if ( pObj->fMark0 )
        return;
    pObj->fMark0 = 1;
    if ( !Gia_ObjIsAnd(pObj) )
        return;
    Acec_MultFindPPs_rec( p, Gia_ObjFaninId0(pObj, iObj), vBold );
    Acec_MultFindPPs_rec( p, Gia_ObjFaninId1(pObj, iObj), vBold );
    Vec_IntPush( vBold, iObj );
}